

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_spinlock_lock(ma_spinlock *pSpinlock)

{
  ma_spinlock mVar1;
  
  if (pSpinlock == (ma_spinlock *)0x0) {
    return MA_INVALID_ARGS;
  }
  while( true ) {
    LOCK();
    mVar1 = *pSpinlock;
    *pSpinlock = 1;
    UNLOCK();
    if (mVar1 == 0) break;
    do {
    } while (*pSpinlock == 1);
  }
  return MA_SUCCESS;
}

Assistant:

static MA_INLINE ma_result ma_spinlock_lock_ex(volatile ma_spinlock* pSpinlock, ma_bool32 yield)
{
    if (pSpinlock == NULL) {
        return MA_INVALID_ARGS;
    }

    for (;;) {
        if (ma_atomic_exchange_explicit_32(pSpinlock, 1, ma_atomic_memory_order_acquire) == 0) {
            break;
        }

        while (ma_atomic_load_explicit_32(pSpinlock, ma_atomic_memory_order_relaxed) == 1) {
            if (yield) {
                ma_yield();
            }
        }
    }

    return MA_SUCCESS;
}